

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O1

UBool __thiscall icu_63::LocalizationInfo::operator==(LocalizationInfo *this,LocalizationInfo *rhs)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int32_t iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  UChar *pUVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong uVar9;
  char cVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  UChar *pUVar7;
  undefined4 extraout_var_00;
  
  if (rhs != (LocalizationInfo *)0x0) {
    if (this == rhs) {
      return '\x01';
    }
    uVar1 = (*this->_vptr_LocalizationInfo[3])(this);
    uVar2 = (*rhs->_vptr_LocalizationInfo[3])(rhs);
    bVar13 = true;
    if (uVar1 == uVar2) {
      if (0 < (int)uVar1) {
        uVar9 = 0;
        do {
          iVar3 = (*this->_vptr_LocalizationInfo[4])(this,uVar9);
          pUVar7 = (UChar *)CONCAT44(extraout_var,iVar3);
          iVar3 = (*rhs->_vptr_LocalizationInfo[4])(rhs,uVar9);
          pUVar8 = (UChar *)CONCAT44(extraout_var_00,iVar3);
          if (pUVar8 != pUVar7) {
            bVar13 = false;
            if (pUVar7 != (UChar *)0x0) {
              uVar2 = 0;
              if (pUVar8 == (UChar *)0x0) goto LAB_0021cb58;
              iVar4 = u_strcmp_63(pUVar7,pUVar8);
              if (iVar4 == 0) goto LAB_0021c9ff;
            }
            bVar13 = false;
            uVar2 = 0;
            goto LAB_0021cb58;
          }
LAB_0021c9ff:
          uVar2 = (int)uVar9 + 1;
          uVar9 = (ulong)uVar2;
        } while (uVar1 != uVar2);
      }
      uVar2 = (*this->_vptr_LocalizationInfo[5])(this);
      uVar5 = (*rhs->_vptr_LocalizationInfo[5])(rhs);
      if (uVar2 == uVar5) {
        if (0 < (int)uVar2) {
          uVar5 = 1;
          if (1 < (int)uVar1) {
            uVar5 = uVar1;
          }
          uVar9 = 0;
          do {
            iVar3 = (*this->_vptr_LocalizationInfo[6])(this,uVar9);
            pUVar7 = (UChar *)CONCAT44(extraout_var_01,iVar3);
            uVar6 = (*rhs->_vptr_LocalizationInfo[8])(rhs,pUVar7);
            iVar3 = (*rhs->_vptr_LocalizationInfo[6])(rhs);
            pUVar8 = (UChar *)CONCAT44(extraout_var_02,iVar3);
            if (pUVar8 == pUVar7) {
              if (0 < (int)uVar1) {
LAB_0021cabc:
                uVar12 = 0;
                do {
                  iVar3 = (*this->_vptr_LocalizationInfo[7])(this,uVar9,uVar12);
                  pUVar7 = (UChar *)CONCAT44(extraout_var_03,iVar3);
                  iVar3 = (*rhs->_vptr_LocalizationInfo[7])(rhs,(ulong)uVar6,uVar12);
                  pUVar8 = (UChar *)CONCAT44(extraout_var_04,iVar3);
                  if (pUVar8 != pUVar7) {
                    bVar13 = false;
                    cVar10 = true;
                    if ((pUVar7 == (UChar *)0x0) || (pUVar8 == (UChar *)0x0)) goto LAB_0021cb1e;
                    iVar4 = u_strcmp_63(pUVar7,pUVar8);
                    if (iVar4 != 0) {
                      bVar13 = false;
                      goto LAB_0021cb1e;
                    }
                  }
                  uVar11 = (int)uVar12 + 1;
                  uVar12 = (ulong)uVar11;
                } while (uVar5 != uVar11);
              }
              cVar10 = false;
              bVar13 = true;
            }
            else {
              bVar13 = false;
              cVar10 = true;
              if ((pUVar7 != (UChar *)0x0) && (pUVar8 != (UChar *)0x0)) {
                iVar4 = u_strcmp_63(pUVar7,pUVar8);
                bVar13 = iVar4 == 0;
                cVar10 = !bVar13;
                if (0 < (int)uVar1 && !(bool)cVar10) goto LAB_0021cabc;
              }
            }
LAB_0021cb1e:
            if (!bVar13) goto LAB_0021cb39;
            uVar6 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar6;
          } while (uVar6 != uVar2);
        }
        cVar10 = '\x05';
LAB_0021cb39:
        uVar2 = (uint)(cVar10 == '\x05');
        bVar13 = cVar10 == '\0';
      }
      else {
        uVar2 = 0;
        bVar13 = true;
      }
    }
LAB_0021cb58:
    if (!bVar13) {
      return (UBool)uVar2;
    }
  }
  return '\0';
}

Assistant:

UBool
LocalizationInfo::operator==(const LocalizationInfo* rhs) const {
    if (rhs) {
        if (this == rhs) {
            return TRUE;
        }
        
        int32_t rsc = getNumberOfRuleSets();
        if (rsc == rhs->getNumberOfRuleSets()) {
            for (int i = 0; i < rsc; ++i) {
                if (!streq(getRuleSetName(i), rhs->getRuleSetName(i))) {
                    return FALSE;
                }
            }
            int32_t dlc = getNumberOfDisplayLocales();
            if (dlc == rhs->getNumberOfDisplayLocales()) {
                for (int i = 0; i < dlc; ++i) {
                    const UChar* locale = getLocaleName(i);
                    int32_t ix = rhs->indexForLocale(locale);
                    // if no locale, ix is -1, getLocaleName returns null, so streq returns false
                    if (!streq(locale, rhs->getLocaleName(ix))) {
                        return FALSE;
                    }
                    for (int j = 0; j < rsc; ++j) {
                        if (!streq(getDisplayName(i, j), rhs->getDisplayName(ix, j))) {
                            return FALSE;
                        }
                    }
                }
                return TRUE;
            }
        }
    }
    return FALSE;
}